

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O1

int64 __thiscall
TTD::EventLog::FindSnapTimeForEventTime(EventLog *this,int64 targetTime,int64 *optEndSnapTime)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  undefined1 local_58 [8];
  Iterator iter;
  bool isSnap;
  bool isRoot;
  bool hasRtrSnap;
  
  if (optEndSnapTime != (int64 *)0x0) {
    *optEndSnapTime = -1;
  }
  TTEventList::GetIteratorAtLast_ReplayOnly((Iterator *)local_58,&this->m_eventList);
  bVar3 = local_58 == (undefined1  [8])0x0;
  lVar2 = -1;
  lVar1 = lVar2;
  if (!bVar3) {
    while ((lVar1 = lVar2, *(TTEventListLink **)((long)local_58 + 8) <= iter.m_currLink &&
           (iter.m_currLink < (TTEventListLink *)*(size_t *)local_58))) {
      iter.m_previousEventMap._5_1_ = '\0';
      iter.m_previousEventMap._6_1_ = 0;
      iter.m_previousEventMap._7_1_ = 0;
      if ((bVar3) ||
         ((iter.m_currLink < *(TTEventListLink **)((long)local_58 + 8) ||
          ((TTEventListLink *)*(size_t *)local_58 <= iter.m_currLink)))) goto LAB_008e3821;
      lVar1 = NSLogEvents::AccessTimeInRootCallOrSnapshot
                        ((EventLogEntry *)
                         (*(byte **)((long)local_58 + 0x10) + (long)&(iter.m_currLink)->CurrPos),
                         (bool *)((long)&iter.m_previousEventMap + 5),
                         (bool *)((long)&iter.m_previousEventMap + 6),
                         (bool *)((long)&iter.m_previousEventMap + 7));
      if (lVar1 <= targetTime &&
          ((iter.m_previousEventMap._7_1_ & iter.m_previousEventMap._6_1_) != 0 ||
          iter.m_previousEventMap._5_1_ != '\0')) break;
      TTEventList::Iterator::MovePrevious_ReplayOnly((Iterator *)local_58);
      bVar3 = local_58 == (undefined1  [8])0x0;
      lVar1 = lVar2;
      if (bVar3) break;
    }
  }
  if (optEndSnapTime == (int64 *)0x0) {
    return lVar1;
  }
  TTEventList::GetIteratorAtFirst((Iterator *)local_58,&this->m_eventList);
  while( true ) {
    if (local_58 == (undefined1  [8])0x0) {
      return lVar1;
    }
    if (iter.m_currLink < *(TTEventListLink **)((long)local_58 + 8)) {
      return lVar1;
    }
    if ((TTEventListLink *)*(size_t *)local_58 <= iter.m_currLink) {
      return lVar1;
    }
    if (((local_58 == (undefined1  [8])0x0) ||
        (iter.m_currLink < *(TTEventListLink **)((long)local_58 + 8))) ||
       ((TTEventListLink *)*(size_t *)local_58 <= iter.m_currLink)) break;
    if ((*(int *)(*(byte **)((long)local_58 + 0x10) + (long)iter.m_currLink) == 1) &&
       (lVar2 = *(long *)(*(byte **)((long)local_58 + 0x10) + 0x10 + (long)iter.m_currLink),
       lVar1 < lVar2)) {
      *optEndSnapTime = lVar2;
      return lVar1;
    }
    TTEventList::Iterator::MoveNext((Iterator *)local_58);
  }
LAB_008e3821:
  TTDAbort_unrecoverable_error("Iterator is invalid!!!");
}

Assistant:

int64 EventLog::FindSnapTimeForEventTime(int64 targetTime, int64* optEndSnapTime)
    {
        int64 snapTime = -1;
        if(optEndSnapTime != nullptr)
        {
            *optEndSnapTime = -1;
        }

        for(auto iter = this->m_eventList.GetIteratorAtLast_ReplayOnly(); iter.IsValid(); iter.MovePrevious_ReplayOnly())
        {
            bool isSnap = false;
            bool isRoot = false;
            bool hasRtrSnap = false;
            int64 time = NSLogEvents::AccessTimeInRootCallOrSnapshot(iter.Current(), isSnap, isRoot, hasRtrSnap);

            bool validSnap =  isSnap | (isRoot & hasRtrSnap);
            if(validSnap && time <= targetTime)
            {
                snapTime = time;
                break;
            }
        }

        if(optEndSnapTime != nullptr)
        {
            for(auto iter = this->m_eventList.GetIteratorAtFirst(); iter.IsValid(); iter.MoveNext())
            {
                if(iter.Current()->EventKind == NSLogEvents::EventKind::SnapshotTag)
                {
                    NSLogEvents::SnapshotEventLogEntry* snapEvent = NSLogEvents::GetInlineEventDataAs<NSLogEvents::SnapshotEventLogEntry, NSLogEvents::EventKind::SnapshotTag>(iter.Current());
                    if(snapEvent->RestoreTimestamp > snapTime)
                    {
                        *optEndSnapTime = snapEvent->RestoreTimestamp;
                        break;
                    }
                }
            }
        }

        return snapTime;
    }